

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O0

uint64_t __thiscall
jessilib::text_hash::operator()
          (text_hash *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_key
          )

{
  char *data;
  char *pcVar1;
  size_type sVar2;
  uint64_t uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_key_local;
  text_hash *this_local;
  
  data = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                   (in_key);
  pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     (in_key);
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_key);
  uVar3 = hash<char>(data,pcVar1 + sVar2);
  return uVar3;
}

Assistant:

auto operator()(const std::basic_string<char>& in_key) const noexcept { // ASSUMES UTF-8
		return hash(in_key.data(), in_key.data() + in_key.size());
	}